

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_dogstatsd.cpp
# Opt level: O3

int __thiscall datadog::Dogstatsd::flush(Dogstatsd *this)

{
  pointer pbVar1;
  pointer pcVar2;
  int iVar3;
  ssize_t sVar4;
  pointer pbVar5;
  ostream *poVar6;
  size_type sVar7;
  int iVar8;
  string buffer;
  ostringstream statd;
  undefined1 *local_1e8;
  size_t local_1e0;
  undefined1 local_1d8 [16];
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  long local_1a8;
  string local_1a0 [104];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  iVar8 = 0;
  if (this->buffered == true) {
    if ((this->cmd_buffer).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->cmd_buffer).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar8 = 0;
    }
    else {
      iVar8 = 0;
      do {
        iVar3 = std::ostream::tellp();
        pbVar5 = (this->cmd_buffer).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        sVar7 = pbVar5[-1]._M_string_length;
        if (0xffbb < (long)iVar3 + sVar7) {
          std::__cxx11::stringbuf::str();
          sVar4 = sendto(this->_sockfd,local_1e8,local_1e0,0,(sockaddr *)&this->_server,0x10);
          local_1c8[0] = local_1b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"");
          std::__cxx11::stringbuf::str(local_1a0);
          if (local_1c8[0] != local_1b8) {
            operator_delete(local_1c8[0]);
          }
          std::ios::clear((int)*(undefined8 *)(local_1a8 + -0x18) + (int)(ostringstream *)&local_1a8
                         );
          if (local_1e8 != local_1d8) {
            operator_delete(local_1e8);
          }
          iVar8 = iVar8 + (int)sVar4;
          pbVar5 = (this->cmd_buffer).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          sVar7 = pbVar5[-1]._M_string_length;
        }
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1a8,pbVar5[-1]._M_dataplus._M_p,sVar7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        pbVar1 = (this->cmd_buffer).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar5 = pbVar1 + -1;
        (this->cmd_buffer).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
        pcVar2 = pbVar1[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != &pbVar1[-1].field_2) {
          operator_delete(pcVar2);
          pbVar5 = (this->cmd_buffer).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      } while ((this->cmd_buffer).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start != pbVar5);
    }
    std::__cxx11::stringbuf::str();
    sVar4 = sendto(this->_sockfd,local_1e8,local_1e0,0,(sockaddr *)&this->_server,0x10);
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8);
    }
    iVar8 = iVar8 + (int)sVar4;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  return iVar8;
}

Assistant:

int Dogstatsd::flush(){
    int ret = 0;
    std::ostringstream statd;
    if(!buffered) {
      return 0;
    }
    while (!cmd_buffer.empty()) {
      if (static_cast<int>(statd.tellp()) + cmd_buffer.back().length() > optimal_payload) {
        std::string buffer(statd.str());
        ret += sendto( _sockfd, buffer.c_str(), buffer.length(), 
            0, (struct sockaddr *)&_server, sizeof(_server));

        //clear the stringstream
        statd.str("");
        statd.clear();
      }
      statd << cmd_buffer.back() << std::endl;
      cmd_buffer.pop_back();
    }

    std::string buffer(statd.str());
    ret += sendto(_sockfd, buffer.c_str(), buffer.length(), 0, (struct sockaddr *)&_server, sizeof(_server));

    return ret;
  }